

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Mitsukeru::
Index_Storage_Memory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
::search(Index_Storage_Memory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *term)

{
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  mapped_type *pmVar3;
  reference __x;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  iterator it;
  _Self local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *term_local;
  Index_Storage_Memory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *this_local;
  
  result = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)term;
  term_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar2);
  local_20 = pvVar2;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->terms,term);
  it._M_current =
       (uint *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::end(&this->terms);
  bVar1 = std::operator!=(&local_28,(_Self *)&it);
  if (bVar1) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->terms,term);
    local_38._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pmVar3);
    while( true ) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->terms,term);
      local_40._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pmVar3);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
      pvVar2 = local_20;
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator*(&local_38);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar2,__x);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_38);
    }
  }
  return local_20;
}

Assistant:

std::vector< Data_T >* search(Term_T term)
    {
      std::vector< Data_T >* result = new std::vector< Data_T >;

      if (terms.find(term) != terms.end()) {
        for (typename std::vector< Data_T >::iterator it=terms[term].begin();it!=terms[term].end();++it) {
          result->push_back(*it);
        }
      }

      return result;
    }